

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall UI::setStyle(UI *this,EStyle styleId)

{
  float fVar1;
  float fVar2;
  float fVar3;
  ImGuiStyle *pIVar4;
  
  pIVar4 = ImGui::GetStyle();
  if (styleId == EStyle_Dark) {
    (this->colors).textFG.x = 0.74509805;
    (this->colors).textFG.y = 0.74509805;
    (this->colors).textFG.z = 0.74509805;
    (this->colors).textFG.w = 1.0;
    (this->colors).titleFG.x = 1.0;
    (this->colors).titleFG.y = 1.0;
    (this->colors).titleFG.z = 1.0;
    (this->colors).titleFG.w = 1.0;
    (this->colors).itemBG.x = 0.1882353;
    (this->colors).itemBG.y = 0.1882353;
    (this->colors).itemBG.z = 0.1882353;
    (this->colors).itemBG.w = 1.0;
    (this->colors).itemBGHovered.x = 0.27058825;
    (this->colors).itemBGHovered.y = 0.27058825;
    (this->colors).itemBGHovered.z = 0.38039216;
    (this->colors).itemBGHovered.w = 1.0;
    (this->colors).itemBGActive.x = 0.25882354;
    (this->colors).itemBGActive.y = 0.5882353;
    (this->colors).itemBGActive.z = 0.98039216;
    (this->colors).itemBGActive.w = 1.0;
    (this->colors).leftPanelBG.x = 0.1882353;
    (this->colors).leftPanelBG.y = 0.1882353;
    (this->colors).leftPanelBG.z = 0.1882353;
    (this->colors).leftPanelBG.w = 1.0;
    (this->colors).leftPanelTextFG.x = 0.74509805;
    (this->colors).leftPanelTextFG.y = 0.74509805;
    (this->colors).leftPanelTextFG.z = 0.74509805;
    (this->colors).leftPanelTextFG.w = 1.0;
    (this->colors).leftPanelTitleFG.x = 1.0;
    (this->colors).leftPanelTitleFG.y = 1.0;
    (this->colors).leftPanelTitleFG.z = 1.0;
    (this->colors).leftPanelTitleFG.w = 1.0;
    (this->colors).mainWindowBG.x = 0.1254902;
    (this->colors).mainWindowBG.y = 0.1254902;
    (this->colors).mainWindowBG.z = 0.1254902;
    (this->colors).mainWindowBG.w = 1.0;
    (this->colors).mainWindowTextFG.x = 0.74509805;
    (this->colors).mainWindowTextFG.y = 0.74509805;
    (this->colors).mainWindowTextFG.z = 0.74509805;
    (this->colors).mainWindowTextFG.w = 1.0;
    (this->colors).mainWindowTitleFG.x = 1.0;
    (this->colors).mainWindowTitleFG.y = 1.0;
    (this->colors).mainWindowTitleFG.z = 1.0;
    (this->colors).mainWindowTitleFG.w = 1.0;
    (this->colors).popupBG.x = 0.078431375;
    (this->colors).popupBG.y = 0.078431375;
    (this->colors).popupBG.z = 0.078431375;
    (this->colors).popupBG.w = 1.0;
    (this->colors).listHeaderFG.x = 1.0;
    (this->colors).listHeaderFG.y = 1.0;
    (this->colors).listHeaderFG.z = 1.0;
    (this->colors).listHeaderFG.w = 1.0;
    (this->colors).channelSelectedBG.x = 0.15294118;
    (this->colors).channelSelectedBG.y = 0.15294118;
    (this->colors).channelSelectedBG.z = 0.23529412;
    (this->colors).channelSelectedBG.w = 1.0;
    (this->colors).channelActiveFG.x = 1.0;
    (this->colors).channelActiveFG.y = 1.0;
    (this->colors).channelActiveFG.z = 1.0;
    (this->colors).channelActiveFG.w = 1.0;
    (this->colors).channelMentionsFG.x = 1.0;
    (this->colors).channelMentionsFG.y = 1.0;
    (this->colors).channelMentionsFG.z = 1.0;
    (this->colors).channelMentionsFG.w = 1.0;
    (this->colors).channelMentionsBG.x = 0.7529412;
    (this->colors).channelMentionsBG.y = 0.0;
    (this->colors).channelMentionsBG.z = 0.0;
    (this->colors).channelMentionsBG.w = 1.0;
    (this->colors).userActiveFG.x = 1.0;
    (this->colors).userActiveFG.y = 1.0;
    (this->colors).userActiveFG.z = 1.0;
    (this->colors).userActiveFG.w = 1.0;
    (this->colors).messageUser.x = 1.0;
    (this->colors).messageUser.y = 1.0;
    (this->colors).messageUser.z = 1.0;
    (this->colors).messageUser.w = 1.0;
    (this->colors).messageTime.x = 0.36078432;
    (this->colors).messageTime.y = 0.36078432;
    (this->colors).messageTime.z = 0.36078432;
    (this->colors).messageTime.w = 1.0;
    (this->colors).messageHovered.x = 0.1882353;
    (this->colors).messageHovered.y = 0.1882353;
    (this->colors).messageHovered.z = 0.1882353;
    (this->colors).messageHovered.w = 1.0;
    (this->colors).messageReact.x = 1.0;
    (this->colors).messageReact.y = 1.0;
    (this->colors).messageReact.z = 0.0;
    (this->colors).messageReact.w = 1.0;
    (this->colors).messageReplies.x = 0.5019608;
    (this->colors).messageReplies.y = 0.5019608;
    (this->colors).messageReplies.z = 1.0;
    (this->colors).messageReplies.w = 1.0;
    (this->colors).inputBG.x = 0.1882353;
    (this->colors).inputBG.y = 0.1882353;
    (this->colors).inputBG.z = 0.1882353;
    (this->colors).inputBG.w = 1.0;
    (this->colors).inputSendBG.x = 0.1882353;
    (this->colors).inputSendBG.y = 0.36078432;
    (this->colors).inputSendBG.z = 0.1882353;
    (this->colors).inputSendBG.w = 1.0;
    (this->colors).inputSendFG.x = 1.0;
    (this->colors).inputSendFG.y = 1.0;
    (this->colors).inputSendFG.z = 1.0;
    (this->colors).inputSendFG.w = 1.0;
    (this->colors).inputSendBGHovered.x = 0.1882353;
    (this->colors).inputSendBGHovered.y = 0.5019608;
    (this->colors).inputSendBGHovered.z = 0.1882353;
    (this->colors).inputSendBGHovered.w = 1.0;
    (this->colors).inputSendBGActive.x = 0.1882353;
    (this->colors).inputSendBGActive.y = 0.7529412;
    (this->colors).inputSendBGActive.z = 0.1882353;
    (this->colors).inputSendBGActive.w = 1.0;
    (this->colors).inputTooltip.x = 1.0;
    (this->colors).inputTooltip.y = 1.0;
    (this->colors).inputTooltip.z = 1.0;
    (this->colors).inputTooltip.w = 1.0;
    (this->colors).buttonActiveFG.x = 1.0;
    (this->colors).buttonActiveFG.y = 1.0;
    (this->colors).buttonActiveFG.z = 1.0;
    (this->colors).buttonActiveFG.w = 1.0;
    (this->colors).indicatorOnline.x = 0.0;
    (this->colors).indicatorOnline.y = 1.0;
    (this->colors).indicatorOnline.z = 0.0;
    (this->colors).indicatorOnline.w = 1.0;
    (this->colors).indicatorOffline.x = 0.74509805;
    (this->colors).indicatorOffline.y = 0.74509805;
    (this->colors).indicatorOffline.z = 0.74509805;
    (this->colors).indicatorOffline.w = 1.0;
  }
  else if (styleId == EStyle_Default) {
    (this->colors).textFG.x = 0.745098;
    (this->colors).textFG.y = 0.745098;
    (this->colors).textFG.z = 0.745098;
    (this->colors).textFG.w = 1.0;
    (this->colors).titleFG.x = 1.0;
    (this->colors).titleFG.y = 1.0;
    (this->colors).titleFG.z = 1.0;
    (this->colors).titleFG.w = 1.0;
    (this->colors).itemBG.x = 0.223529;
    (this->colors).itemBG.y = 0.07451;
    (this->colors).itemBG.z = 0.235294;
    (this->colors).itemBG.w = 1.0;
    (this->colors).itemBGHovered.x = 0.270588;
    (this->colors).itemBGHovered.y = 0.270588;
    (this->colors).itemBGHovered.z = 0.380392;
    (this->colors).itemBGHovered.w = 1.0;
    (this->colors).itemBGActive.x = 0.258824;
    (this->colors).itemBGActive.y = 0.588235;
    (this->colors).itemBGActive.z = 0.980392;
    (this->colors).itemBGActive.w = 1.0;
    (this->colors).leftPanelBG.x = 0.223529;
    (this->colors).leftPanelBG.y = 0.07451;
    (this->colors).leftPanelBG.z = 0.235294;
    (this->colors).leftPanelBG.w = 1.0;
    (this->colors).leftPanelTextFG.x = 0.745098;
    (this->colors).leftPanelTextFG.y = 0.745098;
    (this->colors).leftPanelTextFG.z = 0.745098;
    (this->colors).leftPanelTextFG.w = 1.0;
    (this->colors).leftPanelTitleFG.x = 1.0;
    (this->colors).leftPanelTitleFG.y = 1.0;
    (this->colors).leftPanelTitleFG.z = 1.0;
    (this->colors).leftPanelTitleFG.w = 1.0;
    (this->colors).mainWindowBG.x = 1.0;
    (this->colors).mainWindowBG.y = 1.0;
    (this->colors).mainWindowBG.z = 1.0;
    (this->colors).mainWindowBG.w = 1.0;
    (this->colors).mainWindowTextFG.x = 0.12549;
    (this->colors).mainWindowTextFG.y = 0.12549;
    (this->colors).mainWindowTextFG.z = 0.12549;
    (this->colors).mainWindowTextFG.w = 1.0;
    (this->colors).mainWindowTitleFG.x = 0.0;
    (this->colors).mainWindowTitleFG.y = 0.0;
    (this->colors).mainWindowTitleFG.z = 0.0;
    (this->colors).mainWindowTitleFG.w = 1.0;
    (this->colors).popupBG.x = 0.831373;
    (this->colors).popupBG.y = 0.831373;
    (this->colors).popupBG.z = 0.831373;
    (this->colors).popupBG.w = 1.0;
    (this->colors).listHeaderFG.x = 1.0;
    (this->colors).listHeaderFG.y = 1.0;
    (this->colors).listHeaderFG.z = 1.0;
    (this->colors).listHeaderFG.w = 1.0;
    (this->colors).channelSelectedBG.x = 0.152941;
    (this->colors).channelSelectedBG.y = 0.152941;
    (this->colors).channelSelectedBG.z = 0.235294;
    (this->colors).channelSelectedBG.w = 1.0;
    (this->colors).channelActiveFG.x = 1.0;
    (this->colors).channelActiveFG.y = 1.0;
    (this->colors).channelActiveFG.z = 1.0;
    (this->colors).channelActiveFG.w = 1.0;
    (this->colors).channelMentionsFG.x = 1.0;
    (this->colors).channelMentionsFG.y = 1.0;
    (this->colors).channelMentionsFG.z = 1.0;
    (this->colors).channelMentionsFG.w = 1.0;
    (this->colors).channelMentionsBG.x = 0.752941;
    (this->colors).channelMentionsBG.y = 0.0;
    (this->colors).channelMentionsBG.z = 0.0;
    (this->colors).channelMentionsBG.w = 1.0;
    (this->colors).userActiveFG.x = 1.0;
    (this->colors).userActiveFG.y = 1.0;
    (this->colors).userActiveFG.z = 1.0;
    (this->colors).userActiveFG.w = 1.0;
    (this->colors).messageUser.x = 0.0;
    (this->colors).messageUser.y = 0.0;
    (this->colors).messageUser.z = 0.0;
    (this->colors).messageUser.w = 1.0;
    (this->colors).messageTime.x = 0.360784;
    (this->colors).messageTime.y = 0.360784;
    (this->colors).messageTime.z = 0.360784;
    (this->colors).messageTime.w = 1.0;
    (this->colors).messageHovered.x = 0.94902;
    (this->colors).messageHovered.y = 0.94902;
    (this->colors).messageHovered.z = 0.94902;
    (this->colors).messageHovered.w = 1.0;
    (this->colors).messageReact.x = 0.745098;
    (this->colors).messageReact.y = 0.745098;
    (this->colors).messageReact.z = 0.0;
    (this->colors).messageReact.w = 1.0;
    (this->colors).messageReplies.x = 0.5;
    (this->colors).messageReplies.y = 0.5;
    (this->colors).messageReplies.z = 1.0;
    (this->colors).messageReplies.w = 1.0;
    (this->colors).inputBG.x = 0.94902;
    (this->colors).inputBG.y = 0.94902;
    (this->colors).inputBG.z = 0.94902;
    (this->colors).inputBG.w = 1.0;
    (this->colors).inputSendBG.x = 0.188235;
    (this->colors).inputSendBG.y = 0.360784;
    (this->colors).inputSendBG.z = 0.188235;
    (this->colors).inputSendBG.w = 1.0;
    (this->colors).inputSendFG.x = 1.0;
    (this->colors).inputSendFG.y = 1.0;
    (this->colors).inputSendFG.z = 1.0;
    (this->colors).inputSendFG.w = 1.0;
    (this->colors).inputSendBGHovered.x = 0.188235;
    (this->colors).inputSendBGHovered.y = 0.501961;
    (this->colors).inputSendBGHovered.z = 0.188235;
    (this->colors).inputSendBGHovered.w = 1.0;
    (this->colors).inputSendBGActive.x = 0.188235;
    (this->colors).inputSendBGActive.y = 0.752941;
    (this->colors).inputSendBGActive.z = 0.188235;
    (this->colors).inputSendBGActive.w = 1.0;
    (this->colors).inputTooltip.x = 0.0;
    (this->colors).inputTooltip.y = 0.0;
    (this->colors).inputTooltip.z = 0.0;
    (this->colors).inputTooltip.w = 1.0;
    (this->colors).buttonActiveFG.x = 1.0;
    (this->colors).buttonActiveFG.y = 1.0;
    (this->colors).buttonActiveFG.z = 1.0;
    (this->colors).buttonActiveFG.w = 1.0;
    (this->colors).indicatorOnline.x = 0.0;
    (this->colors).indicatorOnline.y = 1.0;
    (this->colors).indicatorOnline.z = 0.0;
    (this->colors).indicatorOnline.w = 1.0;
    (this->colors).indicatorOffline.x = 0.745098;
    (this->colors).indicatorOffline.y = 0.745098;
    (this->colors).indicatorOffline.z = 0.745098;
    (this->colors).indicatorOffline.w = 1.0;
  }
  fVar1 = (this->colors).textFG.y;
  fVar2 = (this->colors).textFG.z;
  fVar3 = (this->colors).textFG.w;
  pIVar4->Colors[0].x = (this->colors).textFG.x;
  pIVar4->Colors[0].y = fVar1;
  pIVar4->Colors[0].z = fVar2;
  pIVar4->Colors[0].w = fVar3;
  fVar1 = (this->colors).itemBG.y;
  fVar2 = (this->colors).itemBG.z;
  fVar3 = (this->colors).itemBG.w;
  pIVar4->Colors[0x18].x = (this->colors).itemBG.x;
  pIVar4->Colors[0x18].y = fVar1;
  pIVar4->Colors[0x18].z = fVar2;
  pIVar4->Colors[0x18].w = fVar3;
  fVar1 = (this->colors).itemBGHovered.y;
  fVar2 = (this->colors).itemBGHovered.z;
  fVar3 = (this->colors).itemBGHovered.w;
  pIVar4->Colors[0x19].x = (this->colors).itemBGHovered.x;
  pIVar4->Colors[0x19].y = fVar1;
  pIVar4->Colors[0x19].z = fVar2;
  pIVar4->Colors[0x19].w = fVar3;
  fVar1 = (this->colors).itemBGActive.y;
  fVar2 = (this->colors).itemBGActive.z;
  fVar3 = (this->colors).itemBGActive.w;
  pIVar4->Colors[0x1a].x = (this->colors).itemBGActive.x;
  pIVar4->Colors[0x1a].y = fVar1;
  pIVar4->Colors[0x1a].z = fVar2;
  pIVar4->Colors[0x1a].w = fVar3;
  fVar1 = (this->colors).itemBG.y;
  fVar2 = (this->colors).itemBG.z;
  fVar3 = (this->colors).itemBG.w;
  pIVar4->Colors[0x15].x = (this->colors).itemBG.x;
  pIVar4->Colors[0x15].y = fVar1;
  pIVar4->Colors[0x15].z = fVar2;
  pIVar4->Colors[0x15].w = fVar3;
  fVar1 = (this->colors).itemBGHovered.y;
  fVar2 = (this->colors).itemBGHovered.z;
  fVar3 = (this->colors).itemBGHovered.w;
  pIVar4->Colors[0x16].x = (this->colors).itemBGHovered.x;
  pIVar4->Colors[0x16].y = fVar1;
  pIVar4->Colors[0x16].z = fVar2;
  pIVar4->Colors[0x16].w = fVar3;
  fVar1 = (this->colors).itemBGActive.y;
  fVar2 = (this->colors).itemBGActive.z;
  fVar3 = (this->colors).itemBGActive.w;
  pIVar4->Colors[0x17].x = (this->colors).itemBGActive.x;
  pIVar4->Colors[0x17].y = fVar1;
  pIVar4->Colors[0x17].z = fVar2;
  pIVar4->Colors[0x17].w = fVar3;
  fVar1 = (this->colors).popupBG.y;
  fVar2 = (this->colors).popupBG.z;
  fVar3 = (this->colors).popupBG.w;
  pIVar4->Colors[4].x = (this->colors).popupBG.x;
  pIVar4->Colors[4].y = fVar1;
  pIVar4->Colors[4].z = fVar2;
  pIVar4->Colors[4].w = fVar3;
  fVar1 = (this->colors).itemBGActive.y;
  fVar2 = (this->colors).itemBGActive.z;
  fVar3 = (this->colors).itemBGActive.w;
  pIVar4->Colors[5].x = (this->colors).itemBGActive.x;
  pIVar4->Colors[5].y = fVar1;
  pIVar4->Colors[5].z = fVar2;
  pIVar4->Colors[5].w = fVar3;
  fVar1 = (this->colors).itemBG.y;
  fVar2 = (this->colors).itemBG.z;
  fVar3 = (this->colors).itemBG.w;
  pIVar4->Colors[0x21].x = (this->colors).itemBG.x;
  pIVar4->Colors[0x21].y = fVar1;
  pIVar4->Colors[0x21].z = fVar2;
  pIVar4->Colors[0x21].w = fVar3;
  fVar1 = (this->colors).itemBGHovered.y;
  fVar2 = (this->colors).itemBGHovered.z;
  fVar3 = (this->colors).itemBGHovered.w;
  pIVar4->Colors[0x22].x = (this->colors).itemBGHovered.x;
  pIVar4->Colors[0x22].y = fVar1;
  pIVar4->Colors[0x22].z = fVar2;
  pIVar4->Colors[0x22].w = fVar3;
  fVar1 = (this->colors).itemBGActive.y;
  fVar2 = (this->colors).itemBGActive.z;
  fVar3 = (this->colors).itemBGActive.w;
  pIVar4->Colors[0x23].x = (this->colors).itemBGActive.x;
  pIVar4->Colors[0x23].y = fVar1;
  pIVar4->Colors[0x23].z = fVar2;
  pIVar4->Colors[0x23].w = fVar3;
  pIVar4->Colors[0x34].x = 0.0;
  pIVar4->Colors[0x34].y = 0.0;
  pIVar4->Colors[0x34].z = 0.0;
  pIVar4->Colors[0x34].w = 0.0;
  return;
}

Assistant:

void UI::setStyle(EStyle styleId) {
    auto & style = ImGui::GetStyle();

    switch (styleId) {
        case EStyle_Default:
            colors = {
                .textFG             = { 0.745098, 0.745098, 0.745098, 1.000000 },
                .titleFG            = { 1.000000, 1.000000, 1.000000, 1.000000 },
                .itemBG             = { 0.223529, 0.074510, 0.235294, 1.000000 },
                .itemBGHovered      = { 0.270588, 0.270588, 0.380392, 1.000000 },
                .itemBGActive       = { 0.258824, 0.588235, 0.980392, 1.000000 },
                .leftPanelBG        = { 0.223529, 0.074510, 0.235294, 1.000000 },
                .leftPanelTextFG    = { 0.745098, 0.745098, 0.745098, 1.000000 },
                .leftPanelTitleFG   = { 1.000000, 1.000000, 1.000000, 1.000000 },
                .mainWindowBG       = { 1.000000, 1.000000, 1.000000, 1.000000 },
                .mainWindowTextFG   = { 0.125490, 0.125490, 0.125490, 1.000000 },
                .mainWindowTitleFG  = { 0.000000, 0.000000, 0.000000, 1.000000 },
                .popupBG            = { 0.831373, 0.831373, 0.831373, 1.000000 },
                .listHeaderFG       = { 1.000000, 1.000000, 1.000000, 1.000000 },
                .channelSelectedBG  = { 0.152941, 0.152941, 0.235294, 1.000000 },
                .channelActiveFG    = { 1.000000, 1.000000, 1.000000, 1.000000 },
                .channelMentionsFG  = { 1.000000, 1.000000, 1.000000, 1.000000 },
                .channelMentionsBG  = { 0.752941, 0.000000, 0.000000, 1.000000 },
                .userActiveFG       = { 1.000000, 1.000000, 1.000000, 1.000000 },
                .messageUser        = { 0.000000, 0.000000, 0.000000, 1.000000 },
                .messageTime        = { 0.360784, 0.360784, 0.360784, 1.000000 },
                .messageHovered     = { 0.949020, 0.949020, 0.949020, 1.000000 },
                .messageReact       = { 0.745098, 0.745098, 0.000000, 1.000000 },
                .messageReplies     = { 0.500000, 0.500000, 1.000000, 1.000000 },
                .inputBG            = { 0.949020, 0.949020, 0.949020, 1.000000 },
                .inputSendBG        = { 0.188235, 0.360784, 0.188235, 1.000000 },
                .inputSendFG        = { 1.000000, 1.000000, 1.000000, 1.000000 },
                .inputSendBGHovered = { 0.188235, 0.501961, 0.188235, 1.000000 },
                .inputSendBGActive  = { 0.188235, 0.752941, 0.188235, 1.000000 },
                .inputTooltip       = { 0.000000, 0.000000, 0.000000, 1.000000 },
                .buttonActiveFG     = { 1.000000, 1.000000, 1.000000, 1.000000 },
                .indicatorOnline    = { 0.000000, 1.000000, 0.000000, 1.000000 },
                .indicatorOffline   = { 0.745098, 0.745098, 0.745098, 1.000000 },
            };
            break;
        case EStyle_Dark:
            colors = ColorTheme();
            break;
    }

    style.Colors[ImGuiCol_Text]          = colors.textFG;
    style.Colors[ImGuiCol_Header]        = colors.itemBG;
    style.Colors[ImGuiCol_HeaderHovered] = colors.itemBGHovered;
    style.Colors[ImGuiCol_HeaderActive]  = colors.itemBGActive;
    style.Colors[ImGuiCol_Button]        = colors.itemBG;
    style.Colors[ImGuiCol_ButtonHovered] = colors.itemBGHovered;
    style.Colors[ImGuiCol_ButtonActive]  = colors.itemBGActive;
    style.Colors[ImGuiCol_PopupBg]       = colors.popupBG;
    style.Colors[ImGuiCol_Border]        = colors.itemBGActive;
    style.Colors[ImGuiCol_Tab]           = colors.itemBG;
    style.Colors[ImGuiCol_TabHovered]    = colors.itemBGHovered;
    style.Colors[ImGuiCol_TabActive]     = colors.itemBGActive;

    style.Colors[ImGuiCol_ModalWindowDimBg] = toVec4(0, 0, 0, 0);
}